

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportCounter
            (accum,"Intersections/Regular ray intersection tests",
             *(int64_t *)(in_FS_OFFSET + -0x380));
  *(undefined8 *)(in_FS_OFFSET + -0x380) = 0;
  return;
}

Assistant:

pstd::vector<ShapeHandle> ShapeHandle::Create(const std::string &name,
                                              const Transform *renderFromObject,
                                              const Transform *objectFromRender,
                                              bool reverseOrientation,
                                              const ParameterDictionary &parameters,
                                              const FileLoc *loc, Allocator alloc) {
    pstd::vector<ShapeHandle> shapes(alloc);
    if (name == "sphere") {
        shapes = {Sphere::Create(renderFromObject, objectFromRender, reverseOrientation,
                                 parameters, loc, alloc)};
        ++nSpheres;
    }
    // Create remaining single _Shape_ types
    else if (name == "cylinder") {
        shapes = {Cylinder::Create(renderFromObject, objectFromRender, reverseOrientation,
                                   parameters, loc, alloc)};
        ++nCylinders;
    } else if (name == "disk") {
        shapes = {Disk::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc)};
        ++nDisks;
    } else if (name == "bilinearmesh") {
        BilinearPatchMesh *mesh = BilinearPatch::CreateMesh(
            renderFromObject, reverseOrientation, parameters, loc, alloc);
        shapes = BilinearPatch::CreatePatches(mesh, alloc);
    }
    // Create multiple-_Shape_ types
    else if (name == "curve")
        shapes = Curve::Create(renderFromObject, objectFromRender, reverseOrientation,
                               parameters, loc, alloc);
    else if (name == "trianglemesh") {
        TriangleMesh *mesh = Triangle::CreateMesh(renderFromObject, reverseOrientation,
                                                  parameters, loc, alloc);
        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else if (name == "plymesh") {
        std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
        TriQuadMesh plyMesh = TriQuadMesh::ReadPLY(filename);

        if (!plyMesh.triIndices.empty()) {
            TriangleMesh *mesh = alloc.new_object<TriangleMesh>(
                *renderFromObject, reverseOrientation, plyMesh.triIndices, plyMesh.p,
                std::vector<Vector3f>(), plyMesh.n, plyMesh.uv, plyMesh.faceIndices);
            shapes = Triangle::CreateTriangles(mesh, alloc);
        }

        if (!plyMesh.quadIndices.empty()) {
            BilinearPatchMesh *mesh = alloc.new_object<BilinearPatchMesh>(
                *renderFromObject, reverseOrientation, plyMesh.quadIndices, plyMesh.p,
                plyMesh.n, plyMesh.uv, plyMesh.faceIndices, nullptr /* image dist */);
            pstd::vector<ShapeHandle> quadMesh =
                BilinearPatch::CreatePatches(mesh, alloc);
            shapes.insert(shapes.end(), quadMesh.begin(), quadMesh.end());
        }
    } else if (name == "loopsubdiv") {
        int nLevels = parameters.GetOneInt("levels", 3);
        std::vector<int> vertexIndices = parameters.GetIntArray("indices");
        if (vertexIndices.empty())
            ErrorExit(loc, "Vertex indices \"indices\" not provided for "
                           "LoopSubdiv shape.");

        std::vector<Point3f> P = parameters.GetPoint3fArray("P");
        if (P.empty())
            ErrorExit(loc, "Vertex positions \"P\" not provided for LoopSubdiv shape.");

        // don't actually use this for now...
        std::string scheme = parameters.GetOneString("scheme", "loop");

        TriangleMesh *mesh = LoopSubdivide(renderFromObject, reverseOrientation, nLevels,
                                           vertexIndices, P, alloc);

        shapes = Triangle::CreateTriangles(mesh, alloc);
    } else
        ErrorExit(loc, "%s: shape type unknown.", name);

    if (shapes.empty())
        ErrorExit(loc, "%s: unable to create shape.", name);

    return shapes;
}